

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::setEncryptionParametersInternal
          (QPDFWriter *this,int V,int R,int key_len,int P,string *O,string *U,string *OE,string *UE,
          string *Perms,string *id1,string *user_password,string *encryption_key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  mapped_type *pmVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  ulong *puVar9;
  size_type *psVar10;
  EncryptionData *data;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  element_type *peVar16;
  uint uVar17;
  bool bVar18;
  key_type local_280;
  key_type local_260;
  uint local_240;
  uint local_23c;
  EncryptionData encryption_data;
  ulong *local_160;
  long local_158;
  ulong local_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  string *local_140;
  EncryptionData *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  key_type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138 = (EncryptionData *)CONCAT44(in_register_0000000c,key_len);
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar16->encryption_V = V;
  peVar16->encryption_R = R;
  local_23c = P;
  encryption_data._0_8_ = &encryption_data.O;
  local_140 = O;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"/Filter","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,(key_type *)&encryption_data);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x27d98e);
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar14 = -V;
  if (0 < V) {
    uVar14 = V;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar11 = (ulong)uVar14;
    uVar17 = 4;
    do {
      uVar15 = uVar17;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_001e7947;
      }
      if (uVar7 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_001e7947;
      }
      if (uVar7 < 10000) goto LAB_001e7947;
      uVar11 = uVar11 / 10000;
      uVar17 = uVar15 + 4;
    } while (99999 < uVar7);
    uVar15 = uVar15 + 1;
  }
LAB_001e7947:
  encryption_data._0_8_ = &encryption_data.O;
  local_240 = R;
  std::__cxx11::string::_M_construct((ulong)&encryption_data,(char)uVar15 - (char)(V >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)V >> 0x1f) + encryption_data._0_8_),uVar15,uVar14);
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/V","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar15 = (int)local_138 * 8;
  uVar14 = (int)local_138 * -8;
  if ((int)uVar14 < 0) {
    uVar14 = uVar15;
  }
  uVar17 = 1;
  if (9 < uVar14) {
    uVar11 = (ulong)uVar14;
    uVar7 = 4;
    do {
      uVar17 = uVar7;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001e7a65;
      }
      if (uVar8 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001e7a65;
      }
      if (uVar8 < 10000) goto LAB_001e7a65;
      uVar11 = uVar11 / 10000;
      uVar7 = uVar17 + 4;
    } while (99999 < uVar8);
    uVar17 = uVar17 + 1;
  }
LAB_001e7a65:
  encryption_data._0_8_ = &encryption_data.O;
  std::__cxx11::string::_M_construct
            ((ulong)&encryption_data,(char)uVar17 - (char)((int)uVar15 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar15 >> 0x1f) + encryption_data._0_8_),uVar17,uVar14);
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/Length","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,&local_280);
  uVar14 = local_240;
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar15 = -uVar14;
  if (0 < (int)uVar14) {
    uVar15 = uVar14;
  }
  uVar17 = 1;
  if (9 < uVar15) {
    uVar11 = (ulong)uVar15;
    uVar7 = 4;
    do {
      uVar17 = uVar7;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001e7b6f;
      }
      if (uVar8 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001e7b6f;
      }
      if (uVar8 < 10000) goto LAB_001e7b6f;
      uVar11 = uVar11 / 10000;
      uVar7 = uVar17 + 4;
    } while (99999 < uVar8);
    uVar17 = uVar17 + 1;
  }
LAB_001e7b6f:
  encryption_data._0_8_ = &encryption_data.O;
  std::__cxx11::string::_M_construct
            ((ulong)&encryption_data,(char)uVar17 - (char)((int)uVar14 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar14 >> 0x1f) + encryption_data._0_8_),uVar17,uVar15);
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/R","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar14 = -local_23c;
  if (0 < (int)local_23c) {
    uVar14 = local_23c;
  }
  uVar15 = 1;
  if (9 < uVar14) {
    uVar11 = (ulong)uVar14;
    uVar17 = 4;
    do {
      uVar15 = uVar17;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_001e7c79;
      }
      if (uVar7 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_001e7c79;
      }
      if (uVar7 < 10000) goto LAB_001e7c79;
      uVar11 = uVar11 / 10000;
      uVar17 = uVar15 + 4;
    } while (99999 < uVar7);
    uVar15 = uVar15 + 1;
  }
LAB_001e7c79:
  uVar17 = local_23c >> 0x1f;
  encryption_data._0_8_ = &encryption_data.O;
  std::__cxx11::string::_M_construct
            ((ulong)&encryption_data,(char)uVar15 - (char)((int)local_23c >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar17 + encryption_data._0_8_),uVar15,uVar14);
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_280.field_2;
  local_280._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"/P","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
  psVar2 = &encryption_data.O;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  pcVar3 = (local_140->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + local_140->_M_string_length);
  if (local_b0 == &local_a0) {
    local_280.field_2._8_8_ = local_a0._8_8_;
    local_280._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_280._M_dataplus._M_p = (pointer)local_b0;
  }
  local_280.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
  local_280.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
  local_280._M_string_length = local_a8;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_260.field_2;
  local_260._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/O","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,&local_260);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0])
                             + 1);
  }
  pcVar3 = (U->_M_dataplus)._M_p;
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar3,pcVar3 + U->_M_string_length)
  ;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  if (local_d0 == &local_c0) {
    local_280.field_2._8_8_ = local_c0._8_8_;
  }
  else {
    local_280._M_dataplus._M_p = (pointer)local_d0;
  }
  local_280.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_280.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_280._M_string_length = local_c8;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_d0 = &local_c0;
  QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_260._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/U","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,&local_260);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                             + 1);
  }
  if (4 < V) {
    pcVar3 = (OE->_M_dataplus)._M_p;
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar3,pcVar3 + OE->_M_string_length);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    if (local_f0 == &local_e0) {
      local_280.field_2._8_8_ = local_e0._8_8_;
    }
    else {
      local_280._M_dataplus._M_p = (pointer)local_f0;
    }
    local_280.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_280.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_280._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_f0 = &local_e0;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
    peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/OE","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar16->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    pcVar3 = (UE->_M_dataplus)._M_p;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar3,pcVar3 + UE->_M_string_length);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    if (local_110 == &local_100) {
      local_280.field_2._8_8_ = local_100._8_8_;
    }
    else {
      local_280._M_dataplus._M_p = (pointer)local_110;
    }
    local_280.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_280.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_280._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_110 = &local_100;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
    peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/UE","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar16->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,
                      CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1)
      ;
    }
    pcVar3 = (Perms->_M_dataplus)._M_p;
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar3,pcVar3 + Perms->_M_string_length);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    if (local_130 == &local_120) {
      local_280.field_2._8_8_ = local_120._8_8_;
    }
    else {
      local_280._M_dataplus._M_p = (pointer)local_130;
    }
    local_280.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
    local_280.field_2._M_local_buf[0] = local_120._M_local_buf[0];
    local_280._M_string_length = local_128;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    local_130 = &local_120;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_280,true);
    peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"/Perms","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar16->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&encryption_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,
                      CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1)
      ;
    }
  }
  uVar14 = local_240;
  encryption_data._0_8_ = psVar2;
  if ((int)local_240 < 6) {
    if (local_240 != 3) {
      if (local_240 == 4) {
        pcVar12 = "1.5";
        bVar18 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->encrypt_use_aes != false;
        if (bVar18) {
          pcVar12 = "1.6";
        }
        pcVar13 = "1.5";
        if (bVar18) {
          pcVar13 = "1.6";
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&encryption_data,pcVar12,pcVar13 + 3);
        setMinimumPDFVersion(this,(string *)&encryption_data,0);
      }
      else {
        if (local_240 != 5) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.3","");
          setMinimumPDFVersion(this,(string *)&encryption_data,0);
          goto LAB_001e84f6;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.7","");
        setMinimumPDFVersion(this,(string *)&encryption_data,3);
      }
      goto LAB_001e839c;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.4","");
    setMinimumPDFVersion(this,(string *)&encryption_data,0);
LAB_001e84f6:
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"1.7","");
    setMinimumPDFVersion(this,(string *)&encryption_data,8);
LAB_001e839c:
    if ((string *)encryption_data._0_8_ != psVar2) {
      operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1))
      ;
    }
    peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar16->encrypt_metadata == false) {
      encryption_data._0_8_ = psVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&encryption_data,"/EncryptMetadata","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&peVar16->encryption_dictionary,(key_type *)&encryption_data);
      std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x27bdf0);
      goto LAB_001e84f6;
    }
  }
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((V & 0xfffffffeU) != 4) goto LAB_001e8921;
  encryption_data._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"/StmF","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,(key_type *)&encryption_data);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x27d9ac);
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  encryption_data._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encryption_data,"/StrF","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,(key_type *)&encryption_data);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x27d9ac);
  if ((string *)encryption_data._0_8_ != psVar2) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  uVar11 = (ulong)((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->encrypt_use_aes;
  pcVar12 = "/AESV3";
  if ((uint)V < 5) {
    pcVar12 = "/AESV2";
  }
  pcVar13 = "/V2";
  if (uVar11 != 0) {
    pcVar13 = pcVar12;
  }
  encryption_data._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&encryption_data,pcVar13,pcVar13 + uVar11 * 3 + 3);
  std::operator+(&local_50,"<< /StdCF << /AuthEvent /DocOpen /CFM ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &encryption_data);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_150 = *puVar9;
    uStack_148 = (undefined4)plVar5[3];
    uStack_144 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar9;
    local_160 = (ulong *)*plVar5;
  }
  local_158 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar12 = "32";
  if ((uint)V < 5) {
    pcVar12 = "16";
  }
  pcVar13 = "";
  if ((uint)V < 5) {
    pcVar13 = "";
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar12,pcVar13);
  uVar11 = 0xf;
  if (local_160 != &local_150) {
    uVar11 = local_150;
  }
  if (uVar11 < (ulong)(local_88 + local_158)) {
    uVar11 = 0xf;
    if (local_90 != local_80) {
      uVar11 = local_80[0];
    }
    if (uVar11 < (ulong)(local_88 + local_158)) goto LAB_001e873f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_160);
  }
  else {
LAB_001e873f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_90);
  }
  psVar10 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_260.field_2._M_allocated_capacity = *psVar10;
    local_260.field_2._8_8_ = puVar6[3];
    local_260._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_260.field_2._M_allocated_capacity = *psVar10;
    local_260._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_260._M_string_length = puVar6[1];
  *puVar6 = psVar10;
  puVar6[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_280.field_2._M_allocated_capacity = *psVar10;
    local_280.field_2._8_8_ = plVar5[3];
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar10;
    local_280._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_280._M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/CF","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar16->encryption_dictionary,&local_70);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  uVar14 = local_240;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != paVar1) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((string *)encryption_data._0_8_ != &encryption_data.O) {
    operator_delete((void *)encryption_data._0_8_,(ulong)(encryption_data.O._M_dataplus._M_p + 1));
  }
  peVar16 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_001e8921:
  peVar16->encrypted = true;
  data = local_138;
  QPDF::EncryptionData::EncryptionData
            (&encryption_data,V,uVar14,(int)local_138,local_23c,local_140,U,OE,UE,Perms,id1,
             peVar16->encrypt_metadata);
  if (V < 5) {
    QPDF::compute_encryption_key(&local_280,(QPDF *)user_password,(string *)&encryption_data,data);
    std::__cxx11::string::operator=
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->encryption_key,(string *)&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->encryption_key);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.id1._M_dataplus._M_p != &encryption_data.id1.field_2) {
    operator_delete(encryption_data.id1._M_dataplus._M_p,
                    encryption_data.id1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.Perms._M_dataplus._M_p != &encryption_data.Perms.field_2) {
    operator_delete(encryption_data.Perms._M_dataplus._M_p,
                    encryption_data.Perms.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.UE._M_dataplus._M_p != &encryption_data.UE.field_2) {
    operator_delete(encryption_data.UE._M_dataplus._M_p,
                    encryption_data.UE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.OE._M_dataplus._M_p != &encryption_data.OE.field_2) {
    operator_delete(encryption_data.OE._M_dataplus._M_p,
                    encryption_data.OE.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.U._M_dataplus._M_p != &encryption_data.U.field_2) {
    operator_delete(encryption_data.U._M_dataplus._M_p,
                    encryption_data.U.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encryption_data.O._M_dataplus._M_p != &encryption_data.O.field_2) {
    operator_delete(encryption_data.O._M_dataplus._M_p,
                    encryption_data.O.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::setEncryptionParametersInternal(
    int V,
    int R,
    int key_len,
    int P,
    std::string const& O,
    std::string const& U,
    std::string const& OE,
    std::string const& UE,
    std::string const& Perms,
    std::string const& id1,
    std::string const& user_password,
    std::string const& encryption_key)
{
    m->encryption_V = V;
    m->encryption_R = R;
    m->encryption_dictionary["/Filter"] = "/Standard";
    m->encryption_dictionary["/V"] = std::to_string(V);
    m->encryption_dictionary["/Length"] = std::to_string(key_len * 8);
    m->encryption_dictionary["/R"] = std::to_string(R);
    m->encryption_dictionary["/P"] = std::to_string(P);
    m->encryption_dictionary["/O"] = QPDF_String(O).unparse(true);
    m->encryption_dictionary["/U"] = QPDF_String(U).unparse(true);
    if (V >= 5) {
        m->encryption_dictionary["/OE"] = QPDF_String(OE).unparse(true);
        m->encryption_dictionary["/UE"] = QPDF_String(UE).unparse(true);
        m->encryption_dictionary["/Perms"] = QPDF_String(Perms).unparse(true);
    }
    if (R >= 6) {
        setMinimumPDFVersion("1.7", 8);
    } else if (R == 5) {
        setMinimumPDFVersion("1.7", 3);
    } else if (R == 4) {
        setMinimumPDFVersion(m->encrypt_use_aes ? "1.6" : "1.5");
    } else if (R == 3) {
        setMinimumPDFVersion("1.4");
    } else {
        setMinimumPDFVersion("1.3");
    }

    if ((R >= 4) && (!m->encrypt_metadata)) {
        m->encryption_dictionary["/EncryptMetadata"] = "false";
    }
    if ((V == 4) || (V == 5)) {
        // The spec says the value for the crypt filter key can be anything, and xpdf seems to
        // agree.  However, Adobe Reader won't open our files unless we use /StdCF.
        m->encryption_dictionary["/StmF"] = "/StdCF";
        m->encryption_dictionary["/StrF"] = "/StdCF";
        std::string method = (m->encrypt_use_aes ? ((V < 5) ? "/AESV2" : "/AESV3") : "/V2");
        // The PDF spec says the /Length key is optional, but the PDF previewer on some versions of
        // MacOS won't open encrypted files without it.
        m->encryption_dictionary["/CF"] = "<< /StdCF << /AuthEvent /DocOpen /CFM " + method +
            " /Length " + std::string((V < 5) ? "16" : "32") + " >> >>";
    }

    m->encrypted = true;
    QPDF::EncryptionData encryption_data(
        V, R, key_len, P, O, U, OE, UE, Perms, id1, m->encrypt_metadata);
    if (V < 5) {
        m->encryption_key = QPDF::compute_encryption_key(user_password, encryption_data);
    } else {
        m->encryption_key = encryption_key;
    }
}